

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<vec<ConjRule_*>_>::growTo(vec<vec<ConjRule_*>_> *this,uint size)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar2 = (ulong)this->sz;
    lVar3 = uVar2 << 4;
    for (; uVar2 < size; uVar2 = uVar2 + 1) {
      puVar1 = (undefined8 *)((long)&this->data->sz + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar3 = lVar3 + 0x10;
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}